

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Bitmask exprTableUsage(WhereMaskSet *pMaskSet,Expr *p)

{
  Bitmask BVar1;
  Bitmask BVar2;
  ulong uVar3;
  WhereMaskSet *local_28;
  Bitmask mask;
  Expr *p_local;
  WhereMaskSet *pMaskSet_local;
  
  if (p == (Expr *)0x0) {
    pMaskSet_local = (WhereMaskSet *)0x0;
  }
  else if (p->op == 0x98) {
    pMaskSet_local = (WhereMaskSet *)getMask(pMaskSet,p->iTable);
  }
  else {
    BVar1 = exprTableUsage(pMaskSet,p->pRight);
    BVar2 = exprTableUsage(pMaskSet,p->pLeft);
    if ((p->flags & 0x800) == 0x800) {
      uVar3 = exprSelectTableUsage(pMaskSet,(p->x).pSelect);
    }
    else {
      uVar3 = exprListTableUsage(pMaskSet,(p->x).pList);
    }
    local_28 = (WhereMaskSet *)(uVar3 | BVar2 | BVar1);
    pMaskSet_local = local_28;
  }
  return (Bitmask)pMaskSet_local;
}

Assistant:

static Bitmask exprTableUsage(WhereMaskSet *pMaskSet, Expr *p){
  Bitmask mask = 0;
  if( p==0 ) return 0;
  if( p->op==TK_COLUMN ){
    mask = getMask(pMaskSet, p->iTable);
    return mask;
  }
  mask = exprTableUsage(pMaskSet, p->pRight);
  mask |= exprTableUsage(pMaskSet, p->pLeft);
  if( ExprHasProperty(p, EP_xIsSelect) ){
    mask |= exprSelectTableUsage(pMaskSet, p->x.pSelect);
  }else{
    mask |= exprListTableUsage(pMaskSet, p->x.pList);
  }
  return mask;
}